

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,int>>::emplace<QString_const&,int&>
          (QMovableArrayOps<std::pair<QString,int>> *this,qsizetype i,QString *args,int *args_1)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Inserter local_80;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<std::pair<QString,_int>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<std::pair<QString,_int>_> *)this);
      if (qVar2 == 0) goto LAB_004341bc;
      std::pair<QString,_int>::pair<int_&,_true>
                ((pair<QString,_int> *)(*(long *)(this + 0x10) * 0x20 + *(long *)(this + 8)),args,
                 args_1);
LAB_004342af:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_00434269;
    }
LAB_004341bc:
    if (i == 0) {
      qVar2 = QArrayDataPointer<std::pair<QString,_int>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<std::pair<QString,_int>_> *)this);
      if (qVar2 != 0) {
        std::pair<QString,_int>::pair<int_&,_true>
                  ((pair<QString,_int> *)(*(long *)(this + 8) + -0x20),args,args_1);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
        goto LAB_004342af;
      }
    }
  }
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QString,_int>::pair<int_&,_true>((pair<QString,_int> *)local_58,args,args_1);
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QString,_int>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_int>_> *)this,(uint)(i == 0 && lVar1 != 0),1,
             (pair<QString,_int> **)0x0,(QArrayDataPointer<std::pair<QString,_int>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    std::pair<QString,_int>::pair
              ((pair<QString,_int> *)(*(long *)(this + 8) + -0x20),(pair<QString,_int> *)local_58);
    *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<std::pair<QString,_int>_>::Inserter::Inserter
              (&local_80,(QArrayDataPointer<std::pair<QString,_int>_> *)this,i,1);
    std::pair<QString,_int>::pair(local_80.displaceFrom,(pair<QString,_int> *)local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
LAB_00434269:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }